

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

CDNode * __thiscall dg::DOD::ColoredAp::createNode(ColoredAp *this,CDNode *gnode)

{
  mapped_type pCVar1;
  CDNode *pCVar2;
  mapped_type *ppCVar3;
  CDNode *nd;
  CDNode *local_30;
  mapped_type local_28;
  
  local_28 = gnode;
  pCVar2 = CDGraph::createNode(&this->Ap);
  local_30 = pCVar2;
  ppCVar3 = std::__detail::
            _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->_mapping,&local_28);
  pCVar1 = local_28;
  *ppCVar3 = pCVar2;
  ppCVar3 = std::__detail::
            _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->_rev_mapping,&local_30);
  *ppCVar3 = pCVar1;
  return local_30;
}

Assistant:

CDNode *createNode(CDNode *gnode) {
            auto *nd = &Ap.createNode();
            _mapping[gnode] = nd;
            _rev_mapping[nd] = gnode;
            return nd;
        }